

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::WriteUTF16String(ON_BinaryArchive *this,unsigned_short *sUTF16)

{
  bool local_25;
  ON__INT32 local_24;
  bool rc;
  size_t sStack_20;
  ON__UINT32 ui32;
  size_t string_utf16_element_count;
  unsigned_short *sUTF16_local;
  ON_BinaryArchive *this_local;
  
  sStack_20 = 0;
  if (sUTF16 != (unsigned_short *)0x0) {
    for (; sUTF16[sStack_20] != 0; sStack_20 = sStack_20 + 1) {
    }
    if (sStack_20 != 0) {
      sStack_20 = sStack_20 + 1;
    }
  }
  local_24 = (ON__INT32)sStack_20;
  string_utf16_element_count = (size_t)sUTF16;
  sUTF16_local = (unsigned_short *)this;
  local_25 = WriteInt32(this,1,&local_24);
  if ((local_25) && (sStack_20 != 0)) {
    local_25 = WriteShort(this,sStack_20,(ON__UINT16 *)string_utf16_element_count);
  }
  return local_25;
}

Assistant:

bool
ON_BinaryArchive::WriteUTF16String(  
  const unsigned short* sUTF16
  )
{
  // Write nullptr terminated UTF-16 encoded unicode string
  size_t string_utf16_element_count = 0;
  if ( sUTF16 )
  {
    while(sUTF16[string_utf16_element_count])
      string_utf16_element_count++;
    if ( string_utf16_element_count )
      string_utf16_element_count++;
  }
  ON__UINT32 ui32 = (ON__UINT32)string_utf16_element_count;
  bool rc = WriteInt32(1,(ON__INT32*)&ui32);
  if ( rc && string_utf16_element_count > 0 )
  {
    rc = WriteShort( string_utf16_element_count, sUTF16 );
  }
  return rc;  
}